

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

WhereTerm * whereScanNext(WhereScan *pScan)

{
  short sVar1;
  int iTab;
  Parse *pParse_00;
  int iVar2;
  Expr *pEVar3;
  Parse *pParse;
  CollSeq *pColl;
  int j;
  int k;
  WhereTerm *pTerm;
  WhereClause *pWC;
  Expr *pX;
  i16 iColumn;
  int iCur;
  WhereScan *pScan_local;
  
  pColl._4_4_ = pScan->k;
  pTerm = (WhereTerm *)pScan->pWC;
  do {
    sVar1 = pScan->aiColumn[(int)(pScan->iEquiv - 1)];
    iTab = pScan->aiCur[(int)(pScan->iEquiv - 1)];
    do {
      _j = (WhereTerm *)(*(long *)&pTerm->iField + (long)pColl._4_4_ * 0x40);
      for (; iVar2._0_2_ = pTerm->eOperator, iVar2._2_1_ = pTerm->nChild,
          iVar2._3_1_ = pTerm->eMatchOp, pColl._4_4_ < iVar2; pColl._4_4_ = pColl._4_4_ + 1) {
        if ((((_j->leftCursor == iTab) && ((_j->u).leftColumn == (int)sVar1)) &&
            ((sVar1 != -2 ||
             (iVar2 = sqlite3ExprCompareSkip(_j->pExpr->pLeft,pScan->pIdxExpr,iTab), iVar2 == 0))))
           && ((pScan->iEquiv < 2 || ((_j->pExpr->flags & 1) == 0)))) {
          if (((_j->eOperator & 0x800) != 0) &&
             ((pScan->nEquiv < 0xb &&
              (pEVar3 = sqlite3ExprSkipCollate(_j->pExpr->pRight), pEVar3->op == 0x98)))) {
            for (pColl._0_4_ = 0;
                ((int)(uint)pColl < (int)(uint)pScan->nEquiv &&
                ((pScan->aiCur[(int)(uint)pColl] != pEVar3->iTable ||
                 (pScan->aiColumn[(int)(uint)pColl] != pEVar3->iColumn))));
                pColl._0_4_ = (uint)pColl + 1) {
            }
            if ((uint)pColl == pScan->nEquiv) {
              pScan->aiCur[(int)(uint)pColl] = pEVar3->iTable;
              pScan->aiColumn[(int)(uint)pColl] = pEVar3->iColumn;
              pScan->nEquiv = pScan->nEquiv + '\x01';
            }
          }
          if (((uint)_j->eOperator & pScan->opMask) != 0) {
            if ((pScan->zCollName == (char *)0x0) || ((_j->eOperator & 0x100) != 0)) {
LAB_00459453:
              if (((((_j->eOperator & 0x82) == 0) ||
                   (pEVar3 = _j->pExpr->pRight, pEVar3->op != 0x98)) ||
                  (pEVar3->iTable != pScan->aiCur[0])) || (pEVar3->iColumn != pScan->aiColumn[0])) {
                pScan->pWC = (WhereClause *)pTerm;
                pScan->k = pColl._4_4_ + 1;
                return _j;
              }
            }
            else {
              pParse_00 = *(Parse **)pTerm->pExpr;
              pEVar3 = _j->pExpr;
              iVar2 = sqlite3IndexAffinityOk(pEVar3,pScan->idxaff);
              if (iVar2 != 0) {
                pParse = (Parse *)sqlite3BinaryCompareCollSeq
                                            (pParse_00,pEVar3->pLeft,pEVar3->pRight);
                if (pParse == (Parse *)0x0) {
                  pParse = (Parse *)pParse_00->db->pDfltColl;
                }
                iVar2 = sqlite3StrICmp((char *)pParse->db,pScan->zCollName);
                if (iVar2 == 0) goto LAB_00459453;
              }
            }
          }
        }
        _j = _j + 1;
      }
      pTerm = (WhereTerm *)pTerm->pWC;
      pColl._4_4_ = 0;
    } while ((WhereClause *)pTerm != (WhereClause *)0x0);
    if (pScan->nEquiv <= pScan->iEquiv) {
      return (WhereTerm *)0x0;
    }
    pTerm = (WhereTerm *)pScan->pOrigWC;
    pColl._4_4_ = 0;
    pScan->iEquiv = pScan->iEquiv + '\x01';
  } while( true );
}

Assistant:

static WhereTerm *whereScanNext(WhereScan *pScan){
  int iCur;            /* The cursor on the LHS of the term */
  i16 iColumn;         /* The column on the LHS of the term.  -1 for IPK */
  Expr *pX;            /* An expression being tested */
  WhereClause *pWC;    /* Shorthand for pScan->pWC */
  WhereTerm *pTerm;    /* The term being tested */
  int k = pScan->k;    /* Where to start scanning */

  assert( pScan->iEquiv<=pScan->nEquiv );
  pWC = pScan->pWC;
  while(1){
    iColumn = pScan->aiColumn[pScan->iEquiv-1];
    iCur = pScan->aiCur[pScan->iEquiv-1];
    assert( pWC!=0 );
    do{
      for(pTerm=pWC->a+k; k<pWC->nTerm; k++, pTerm++){
        if( pTerm->leftCursor==iCur
         && pTerm->u.leftColumn==iColumn
         && (iColumn!=XN_EXPR
             || sqlite3ExprCompareSkip(pTerm->pExpr->pLeft,
                                       pScan->pIdxExpr,iCur)==0)
         && (pScan->iEquiv<=1 || !ExprHasProperty(pTerm->pExpr, EP_FromJoin))
        ){
          if( (pTerm->eOperator & WO_EQUIV)!=0
           && pScan->nEquiv<ArraySize(pScan->aiCur)
           && (pX = sqlite3ExprSkipCollate(pTerm->pExpr->pRight))->op==TK_COLUMN
          ){
            int j;
            for(j=0; j<pScan->nEquiv; j++){
              if( pScan->aiCur[j]==pX->iTable
               && pScan->aiColumn[j]==pX->iColumn ){
                  break;
              }
            }
            if( j==pScan->nEquiv ){
              pScan->aiCur[j] = pX->iTable;
              pScan->aiColumn[j] = pX->iColumn;
              pScan->nEquiv++;
            }
          }
          if( (pTerm->eOperator & pScan->opMask)!=0 ){
            /* Verify the affinity and collating sequence match */
            if( pScan->zCollName && (pTerm->eOperator & WO_ISNULL)==0 ){
              CollSeq *pColl;
              Parse *pParse = pWC->pWInfo->pParse;
              pX = pTerm->pExpr;
              if( !sqlite3IndexAffinityOk(pX, pScan->idxaff) ){
                continue;
              }
              assert(pX->pLeft);
              pColl = sqlite3BinaryCompareCollSeq(pParse,
                                                  pX->pLeft, pX->pRight);
              if( pColl==0 ) pColl = pParse->db->pDfltColl;
              if( sqlite3StrICmp(pColl->zName, pScan->zCollName) ){
                continue;
              }
            }
            if( (pTerm->eOperator & (WO_EQ|WO_IS))!=0
             && (pX = pTerm->pExpr->pRight)->op==TK_COLUMN
             && pX->iTable==pScan->aiCur[0]
             && pX->iColumn==pScan->aiColumn[0]
            ){
              testcase( pTerm->eOperator & WO_IS );
              continue;
            }
            pScan->pWC = pWC;
            pScan->k = k+1;
            return pTerm;
          }
        }
      }
      pWC = pWC->pOuter;
      k = 0;
    }while( pWC!=0 );
    if( pScan->iEquiv>=pScan->nEquiv ) break;
    pWC = pScan->pOrigWC;
    k = 0;
    pScan->iEquiv++;
  }
  return 0;
}